

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

int FString::FormatHelper(void *data,char *cstr,int len)

{
  size_t sVar1;
  FStringData *pFVar2;
  size_t len1;
  FString *str;
  int len_local;
  char *cstr_local;
  void *data_local;
  
  sVar1 = Len((FString *)data);
  pFVar2 = Data((FString *)data);
  if (((ulong)pFVar2->AllocLen < sVar1 + (long)len) || (*data == 0xa28dbc)) {
    ReallocBuffer((FString *)data,sVar1 + (long)len + 0x7f & 0xffffffffffffff80);
  }
  StrCopy((char *)(*data + sVar1),cstr,(long)len);
  pFVar2 = Data((FString *)data);
  pFVar2->Len = (int)sVar1 + len;
  return len;
}

Assistant:

int FString::FormatHelper (void *data, const char *cstr, int len)
{
	FString *str = (FString *)data;
	size_t len1 = str->Len();
	if (len1 + len > str->Data()->AllocLen || str->Chars == &NullString.Nothing[0])
	{
		str->ReallocBuffer((len1 + len + 127) & ~127);
	}
	StrCopy (str->Chars + len1, cstr, len);
	str->Data()->Len = (unsigned int)(len1 + len);
	return len;
}